

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list_distance.cpp
# Opt level: O1

void duckdb::ListGenericFold<float,duckdb::CosineDistanceOp>
               (DataChunk *args,ExpressionState *state,Vector *result)

{
  ulong *puVar1;
  value_type vVar2;
  value_type vVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  UnifiedVectorFormat *pUVar8;
  float *pfVar9;
  long lVar10;
  list_entry_t *plVar11;
  long lVar12;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var13;
  long lVar14;
  undefined4 uVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  undefined4 uVar19;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var15;
  byte bVar20;
  anon_class_24_3_3d016869 fun;
  anon_class_24_3_3d016869 fun_00;
  anon_class_24_3_3d016869 fun_01;
  anon_class_24_3_3d016869 fun_02;
  anon_class_24_3_3d016869 fun_03;
  anon_class_24_3_3d016869 fun_04;
  anon_class_24_3_3d016869 fun_05;
  anon_class_24_3_3d016869 fun_06;
  anon_class_24_3_3d016869 fun_07;
  anon_class_24_3_3d016869 fun_08;
  anon_class_24_3_3d016869 fun_09;
  anon_class_24_3_3d016869 fun_10;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var21;
  _Alloc_hider _Var22;
  size_type sVar23;
  char cVar24;
  BoundFunctionExpression *pBVar25;
  reference vector;
  reference pvVar26;
  idx_t iVar27;
  idx_t count;
  Vector *pVVar28;
  Vector *vector_00;
  idx_t iVar29;
  TemplatedValidityData<unsigned_long> *pTVar30;
  UnifiedVectorFormat *pUVar31;
  _Head_base<0UL,_unsigned_long_*,_false> _Var32;
  InvalidInputException *pIVar33;
  ulong uVar34;
  ulong uVar35;
  idx_t idx_in_entry;
  ulong uVar36;
  VectorType VVar37;
  uint64_t *puVar38;
  long lVar39;
  UnifiedVectorFormat *pUVar40;
  UnifiedVectorFormat *pUVar41;
  ulong uVar42;
  float fVar43;
  list_entry_t right;
  list_entry_t right_00;
  list_entry_t right_01;
  list_entry_t right_02;
  list_entry_t right_03;
  list_entry_t right_04;
  list_entry_t right_05;
  list_entry_t lVar44;
  list_entry_t left;
  list_entry_t left_00;
  list_entry_t left_01;
  list_entry_t left_02;
  list_entry_t left_03;
  list_entry_t left_04;
  list_entry_t left_05;
  list_entry_t left_06;
  UnifiedVectorFormat ldata;
  float *rhs_data;
  float *lhs_data;
  uint64_t *local_188;
  UnifiedVectorFormat *local_138;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_130;
  string local_128;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_108;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_e8;
  DataChunk *local_d8;
  unsigned_long local_d0;
  UnifiedVectorFormat *local_c8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_c0;
  long local_b8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_a8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_88;
  float *local_80;
  undefined1 local_78 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  pBVar25 = BaseExpression::Cast<duckdb::BoundFunctionExpression>(*(BaseExpression **)(state + 8));
  pUVar8 = *(UnifiedVectorFormat **)(args + 0x18);
  vector = vector<duckdb::Vector,_true>::operator[]((vector<duckdb::Vector,_true> *)args,0);
  local_d8 = args;
  pvVar26 = vector<duckdb::Vector,_true>::operator[]((vector<duckdb::Vector,_true> *)args,1);
  iVar27 = duckdb::ListVector::GetListSize(vector);
  count = duckdb::ListVector::GetListSize(pvVar26);
  pVVar28 = (Vector *)duckdb::ListVector::GetEntry(vector);
  vector_00 = (Vector *)duckdb::ListVector::GetEntry(pvVar26);
  duckdb::Vector::Flatten((ulong)pVVar28);
  duckdb::Vector::Flatten((ulong)vector_00);
  FlatVector::VerifyFlatVector(pVVar28);
  iVar29 = TemplatedValidityMask<unsigned_long>::CountValid
                     ((TemplatedValidityMask<unsigned_long> *)(pVVar28 + 0x28),iVar27);
  if (iVar29 != iVar27) {
    pIVar33 = (InvalidInputException *)__cxa_allocate_exception(0x10);
    local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_128,"%s: left argument can not contain NULL values","");
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_50,*(long *)(pBVar25 + 0x60),
               *(long *)(pBVar25 + 0x68) + *(long *)(pBVar25 + 0x60));
    InvalidInputException::InvalidInputException<std::__cxx11::string>(pIVar33,&local_128,&local_50)
    ;
    __cxa_throw(pIVar33,&InvalidInputException::typeinfo,std::runtime_error::~runtime_error);
  }
  FlatVector::VerifyFlatVector(vector_00);
  iVar27 = TemplatedValidityMask<unsigned_long>::CountValid
                     ((TemplatedValidityMask<unsigned_long> *)(vector_00 + 0x28),count);
  if (iVar27 != count) {
    pIVar33 = (InvalidInputException *)__cxa_allocate_exception(0x10);
    local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_128,"%s: right argument can not contain NULL values","");
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_70,*(long *)(pBVar25 + 0x60),
               *(long *)(pBVar25 + 0x68) + *(long *)(pBVar25 + 0x60));
    InvalidInputException::InvalidInputException<std::__cxx11::string>(pIVar33,&local_128,&local_70)
    ;
    __cxa_throw(pIVar33,&InvalidInputException::typeinfo,std::runtime_error::~runtime_error);
  }
  pBVar25 = pBVar25 + 0x60;
  local_78 = *(undefined1 (*) [8])(pVVar28 + 0x20);
  local_80 = *(float **)(vector_00 + 0x20);
  vVar2 = *vector;
  vVar3 = *pvVar26;
  VVar37 = (VectorType)result;
  if (((byte)vVar2 ^ 2) == 0 && ((byte)vVar3 ^ 2) == 0) {
    duckdb::Vector::SetVectorType(VVar37);
    pfVar9 = *(float **)(result + 0x20);
    if (((*(byte **)(vector + 0x28) == (byte *)0x0) || ((**(byte **)(vector + 0x28) & 1) != 0)) &&
       ((*(byte **)(pvVar26 + 0x28) == (byte *)0x0 || ((**(byte **)(pvVar26 + 0x28) & 1) != 0)))) {
      fun.lhs_data = (float **)local_78;
      fun.func_name = (string *)pBVar25;
      fun.rhs_data = &local_80;
      fVar43 = BinaryLambdaWrapperWithNulls::
               Operation<duckdb::ListGenericFold<float,duckdb::CosineDistanceOp>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::list_entry_t_const&,duckdb::list_entry_t_const&,duckdb::ValidityMask&,unsigned_long)_1_,bool,duckdb::list_entry_t,duckdb::list_entry_t,float>
                         (fun,**(list_entry_t **)(vector + 0x20),**(list_entry_t **)(pvVar26 + 0x20)
                          ,(ValidityMask *)(result + 0x28),0);
      *pfVar9 = fVar43;
      goto LAB_0069f596;
    }
  }
  else {
    if (((byte)vVar3 ^ 2) == 0 && vVar2 == (value_type)0x0) {
      lVar10 = *(long *)(vector + 0x20);
      plVar11 = *(list_entry_t **)(pvVar26 + 0x20);
      if ((*(byte **)(pvVar26 + 0x28) == (byte *)0x0) || ((**(byte **)(pvVar26 + 0x28) & 1) != 0)) {
        duckdb::Vector::SetVectorType(VVar37);
        lVar12 = *(long *)(result + 0x20);
        FlatVector::VerifyFlatVector(result);
        pVVar28 = result + 0x28;
        FlatVector::VerifyFlatVector(vector);
        *(UnifiedVectorFormat **)(result + 0x40) = pUVar8;
        if (*(long *)(vector + 0x28) == 0) {
          p_Var13 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(result + 0x38);
          *(undefined8 *)(result + 0x30) = 0;
          *(undefined8 *)(result + 0x38) = 0;
          local_c8 = pUVar8;
          if (p_Var13 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var13);
          }
          _Var32._M_head_impl = (unsigned_long *)0x0;
        }
        else {
          local_c8 = pUVar8;
          make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long*const&,unsigned_long&>
                    ((duckdb *)&local_128,(unsigned_long **)(vector + 0x28),
                     (unsigned_long *)&local_c8);
          sVar23 = local_128._M_string_length;
          _Var22._M_p = local_128._M_dataplus._M_p;
          local_128._M_dataplus._M_p = (pointer)0x0;
          local_128._M_string_length = 0;
          p_Var13 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(result + 0x38);
          *(pointer *)(result + 0x30) = _Var22._M_p;
          *(size_type *)(result + 0x38) = sVar23;
          if (p_Var13 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var13);
          }
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_128._M_string_length !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_128._M_string_length);
          }
          pTVar30 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                              ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)
                               (result + 0x30));
          _Var32._M_head_impl =
               (pTVar30->owned_data).
               super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
               super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
               super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
               super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
        }
        *(unsigned_long **)pVVar28 = _Var32._M_head_impl;
        if (_Var32._M_head_impl == (unsigned_long *)0x0) {
          if (pUVar8 != (UnifiedVectorFormat *)0x0) {
            lVar44 = *plVar11;
            local_188 = (uint64_t *)(lVar10 + 8);
            pUVar41 = (UnifiedVectorFormat *)0x0;
            do {
              fun_03.lhs_data = (float **)local_78;
              fun_03.func_name = (string *)pBVar25;
              fun_03.rhs_data = &local_80;
              left_02.length = *local_188;
              left_02.offset = local_188[-1];
              fVar43 = BinaryLambdaWrapperWithNulls::
                       Operation<duckdb::ListGenericFold<float,duckdb::CosineDistanceOp>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::list_entry_t_const&,duckdb::list_entry_t_const&,duckdb::ValidityMask&,unsigned_long)_1_,bool,duckdb::list_entry_t,duckdb::list_entry_t,float>
                                 (fun_03,left_02,lVar44,(ValidityMask *)pVVar28,(idx_t)pUVar41);
              *(float *)(lVar12 + (long)pUVar41 * 4) = fVar43;
              pUVar41 = pUVar41 + 1;
              local_188 = local_188 + 2;
            } while (pUVar8 != pUVar41);
          }
        }
        else if ((UnifiedVectorFormat *)0x3f < pUVar8 + 0x3f) {
          lVar10 = lVar10 + 8;
          uVar34 = 0;
          pUVar41 = (UnifiedVectorFormat *)0x0;
          do {
            if (*(long *)pVVar28 == 0) {
              uVar35 = 0xffffffffffffffff;
            }
            else {
              uVar35 = *(ulong *)(*(long *)pVVar28 + uVar34 * 8);
            }
            pUVar31 = pUVar41 + 0x40;
            if (pUVar8 <= pUVar41 + 0x40) {
              pUVar31 = pUVar8;
            }
            pUVar40 = pUVar31;
            if (uVar35 != 0) {
              pUVar40 = pUVar41;
              if (uVar35 == 0xffffffffffffffff) {
                if (pUVar41 < pUVar31) {
                  lVar44 = *plVar11;
                  puVar38 = (uint64_t *)((long)pUVar41 * 0x10 + lVar10);
                  do {
                    fun_01.lhs_data = (float **)local_78;
                    fun_01.func_name = (string *)pBVar25;
                    fun_01.rhs_data = &local_80;
                    left_00.length = *puVar38;
                    left_00.offset = puVar38[-1];
                    fVar43 = BinaryLambdaWrapperWithNulls::
                             Operation<duckdb::ListGenericFold<float,duckdb::CosineDistanceOp>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::list_entry_t_const&,duckdb::list_entry_t_const&,duckdb::ValidityMask&,unsigned_long)_1_,bool,duckdb::list_entry_t,duckdb::list_entry_t,float>
                                       (fun_01,left_00,lVar44,(ValidityMask *)pVVar28,(idx_t)pUVar40
                                       );
                    *(float *)(lVar12 + (long)pUVar40 * 4) = fVar43;
                    pUVar40 = pUVar40 + 1;
                    puVar38 = puVar38 + 2;
                  } while (pUVar31 != pUVar40);
                }
              }
              else if (pUVar41 < pUVar31) {
                puVar38 = (uint64_t *)((long)pUVar41 * 0x10 + lVar10);
                uVar36 = 0;
                do {
                  if ((uVar35 >> (uVar36 & 0x3f) & 1) != 0) {
                    fun_02.lhs_data = (float **)local_78;
                    fun_02.func_name = (string *)pBVar25;
                    fun_02.rhs_data = &local_80;
                    left_01.length = *puVar38;
                    left_01.offset = puVar38[-1];
                    fVar43 = BinaryLambdaWrapperWithNulls::
                             Operation<duckdb::ListGenericFold<float,duckdb::CosineDistanceOp>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::list_entry_t_const&,duckdb::list_entry_t_const&,duckdb::ValidityMask&,unsigned_long)_1_,bool,duckdb::list_entry_t,duckdb::list_entry_t,float>
                                       (fun_02,left_01,*plVar11,(ValidityMask *)pVVar28,
                                        (idx_t)(pUVar41 + uVar36));
                    *(float *)(lVar12 + (long)pUVar41 * 4 + uVar36 * 4) = fVar43;
                  }
                  uVar36 = uVar36 + 1;
                  puVar38 = puVar38 + 2;
                } while (pUVar41 + (uVar36 - (long)pUVar31) != (UnifiedVectorFormat *)0x0);
                pUVar40 = pUVar41 + uVar36;
              }
            }
            uVar34 = uVar34 + 1;
            pUVar41 = pUVar40;
          } while (uVar34 != (ulong)(pUVar8 + 0x3f) >> 6);
        }
        goto LAB_0069f596;
      }
    }
    else {
      if (((byte)vVar2 ^ 2) != 0 || vVar3 != (value_type)0x0) {
        if (vVar3 == (value_type)0x0 && vVar2 == (value_type)0x0) {
          lVar10 = *(long *)(vector + 0x20);
          lVar12 = *(long *)(pvVar26 + 0x20);
          local_128._M_dataplus._M_p = (pointer)pBVar25;
          local_128._M_string_length = (size_type)local_78;
          local_128.field_2._M_allocated_capacity = (size_type)&local_80;
          duckdb::Vector::SetVectorType(VVar37);
          lVar14 = *(long *)(result + 0x20);
          FlatVector::VerifyFlatVector(result);
          pVVar28 = result + 0x28;
          FlatVector::VerifyFlatVector(vector);
          *(UnifiedVectorFormat **)(result + 0x40) = pUVar8;
          local_138 = pUVar8;
          if (*(long *)(vector + 0x28) == 0) {
            p_Var13 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(result + 0x38);
            *(undefined8 *)(result + 0x30) = 0;
            *(undefined8 *)(result + 0x38) = 0;
            if (p_Var13 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var13);
            }
            _Var32._M_head_impl = (unsigned_long *)0x0;
          }
          else {
            make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long*const&,unsigned_long&>
                      ((duckdb *)&local_c8,(unsigned_long **)(vector + 0x28),
                       (unsigned_long *)&local_138);
            p_Var15 = p_Stack_c0;
            pUVar41 = local_c8;
            local_c8 = (UnifiedVectorFormat *)0x0;
            p_Stack_c0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            p_Var13 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(result + 0x38);
            *(UnifiedVectorFormat **)(result + 0x30) = pUVar41;
            *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(result + 0x38) = p_Var15;
            if (p_Var13 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var13);
            }
            if (p_Stack_c0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_c0);
            }
            pTVar30 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                                ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)
                                 (result + 0x30));
            _Var32._M_head_impl =
                 (pTVar30->owned_data).
                 super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
                 super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
                 super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                 super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
          }
          *(unsigned_long **)pVVar28 = _Var32._M_head_impl;
          FlatVector::VerifyFlatVector(pvVar26);
          pvVar26 = pvVar26 + 0x28;
          if (_Var32._M_head_impl == (unsigned_long *)0x0) {
            *(UnifiedVectorFormat **)(result + 0x40) = pUVar8;
            if (*(long *)pvVar26 == 0) {
              p_Var13 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(result + 0x38);
              *(undefined8 *)(result + 0x30) = 0;
              *(undefined8 *)(result + 0x38) = 0;
              local_138 = pUVar8;
              if (p_Var13 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var13);
              }
              _Var32._M_head_impl = (unsigned_long *)0x0;
            }
            else {
              local_138 = pUVar8;
              make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long*const&,unsigned_long&>
                        ((duckdb *)&local_c8,(unsigned_long **)pvVar26,(unsigned_long *)&local_138);
              p_Var15 = p_Stack_c0;
              pUVar41 = local_c8;
              local_c8 = (UnifiedVectorFormat *)0x0;
              p_Stack_c0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
              p_Var13 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(result + 0x38);
              *(UnifiedVectorFormat **)(result + 0x30) = pUVar41;
              *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(result + 0x38) = p_Var15;
              if (p_Var13 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var13);
              }
              if (p_Stack_c0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_c0);
              }
              pTVar30 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                                  ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *
                                   )(result + 0x30));
              _Var32._M_head_impl =
                   (pTVar30->owned_data).
                   super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
                   super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
                   super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                   super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
            }
            *(unsigned_long **)pVVar28 = _Var32._M_head_impl;
          }
          else {
            duckdb::ValidityMask::Combine((ValidityMask *)pVVar28,(ulong)pvVar26);
          }
          if (*(long *)pVVar28 == 0) {
            if (pUVar8 != (UnifiedVectorFormat *)0x0) {
              lVar39 = 8;
              pUVar41 = (UnifiedVectorFormat *)0x0;
              do {
                fun_10.lhs_data = (float **)local_128._M_string_length;
                fun_10.func_name = (string *)local_128._M_dataplus._M_p;
                fun_10.rhs_data = (float **)local_128.field_2._M_allocated_capacity;
                lVar44.length = *(uint64_t *)(lVar12 + lVar39);
                lVar44.offset = *(uint64_t *)(lVar12 + -8 + lVar39);
                left_06.length = *(uint64_t *)(lVar10 + lVar39);
                left_06.offset = *(uint64_t *)(lVar10 + -8 + lVar39);
                fVar43 = BinaryLambdaWrapperWithNulls::
                         Operation<duckdb::ListGenericFold<float,duckdb::CosineDistanceOp>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::list_entry_t_const&,duckdb::list_entry_t_const&,duckdb::ValidityMask&,unsigned_long)_1_,bool,duckdb::list_entry_t,duckdb::list_entry_t,float>
                                   (fun_10,left_06,lVar44,(ValidityMask *)pVVar28,(idx_t)pUVar41);
                *(float *)(lVar14 + (long)pUVar41 * 4) = fVar43;
                pUVar41 = pUVar41 + 1;
                lVar39 = lVar39 + 0x10;
              } while (pUVar8 != pUVar41);
            }
          }
          else if ((UnifiedVectorFormat *)0x3f < pUVar8 + 0x3f) {
            uVar34 = 0;
            pUVar41 = (UnifiedVectorFormat *)0x0;
            do {
              if (*(long *)pVVar28 == 0) {
                uVar35 = 0xffffffffffffffff;
              }
              else {
                uVar35 = *(ulong *)(*(long *)pVVar28 + uVar34 * 8);
              }
              pUVar31 = pUVar41 + 0x40;
              if (pUVar8 <= pUVar41 + 0x40) {
                pUVar31 = pUVar8;
              }
              pUVar40 = pUVar31;
              if (uVar35 != 0) {
                pUVar40 = pUVar41;
                if (uVar35 == 0xffffffffffffffff) {
                  if (pUVar41 < pUVar31) {
                    uVar35 = (long)pUVar41 << 4 | 8;
                    do {
                      fun_08.lhs_data = (float **)local_128._M_string_length;
                      fun_08.func_name = (string *)local_128._M_dataplus._M_p;
                      fun_08.rhs_data = (float **)local_128.field_2._M_allocated_capacity;
                      right_04.length = *(uint64_t *)(lVar12 + uVar35);
                      right_04.offset = *(uint64_t *)(lVar12 + -8 + uVar35);
                      left_04.length = *(uint64_t *)(lVar10 + uVar35);
                      left_04.offset = *(uint64_t *)(lVar10 + -8 + uVar35);
                      fVar43 = BinaryLambdaWrapperWithNulls::
                               Operation<duckdb::ListGenericFold<float,duckdb::CosineDistanceOp>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::list_entry_t_const&,duckdb::list_entry_t_const&,duckdb::ValidityMask&,unsigned_long)_1_,bool,duckdb::list_entry_t,duckdb::list_entry_t,float>
                                         (fun_08,left_04,right_04,(ValidityMask *)pVVar28,
                                          (idx_t)pUVar41);
                      *(float *)(lVar14 + (long)pUVar41 * 4) = fVar43;
                      pUVar41 = pUVar41 + 1;
                      uVar35 = uVar35 + 0x10;
                      pUVar40 = pUVar41;
                    } while (pUVar31 != pUVar41);
                  }
                }
                else if (pUVar41 < pUVar31) {
                  uVar36 = (long)pUVar41 << 4 | 8;
                  uVar42 = 0;
                  do {
                    if ((uVar35 >> (uVar42 & 0x3f) & 1) != 0) {
                      fun_09.lhs_data = (float **)local_128._M_string_length;
                      fun_09.func_name = (string *)local_128._M_dataplus._M_p;
                      fun_09.rhs_data = (float **)local_128.field_2._M_allocated_capacity;
                      right_05.length = *(uint64_t *)(lVar12 + uVar36);
                      right_05.offset = *(uint64_t *)(lVar12 + -8 + uVar36);
                      left_05.length = *(uint64_t *)(lVar10 + uVar36);
                      left_05.offset = *(uint64_t *)(lVar10 + -8 + uVar36);
                      fVar43 = BinaryLambdaWrapperWithNulls::
                               Operation<duckdb::ListGenericFold<float,duckdb::CosineDistanceOp>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::list_entry_t_const&,duckdb::list_entry_t_const&,duckdb::ValidityMask&,unsigned_long)_1_,bool,duckdb::list_entry_t,duckdb::list_entry_t,float>
                                         (fun_09,left_05,right_05,(ValidityMask *)pVVar28,
                                          (idx_t)(pUVar41 + uVar42));
                      *(float *)(lVar14 + (long)pUVar41 * 4 + uVar42 * 4) = fVar43;
                    }
                    uVar42 = uVar42 + 1;
                    uVar36 = uVar36 + 0x10;
                  } while (pUVar41 + (uVar42 - (long)pUVar31) != (UnifiedVectorFormat *)0x0);
                  pUVar40 = pUVar41 + uVar42;
                }
              }
              uVar34 = uVar34 + 1;
              pUVar41 = pUVar40;
            } while (uVar34 != (ulong)(pUVar8 + 0x3f) >> 6);
          }
        }
        else {
          duckdb::UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&local_128);
          duckdb::UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&local_c8);
          duckdb::Vector::ToUnifiedFormat((ulong)vector,pUVar8);
          duckdb::Vector::ToUnifiedFormat((ulong)pvVar26,pUVar8);
          duckdb::Vector::SetVectorType(VVar37);
          p_Var13 = p_Stack_c0;
          pUVar41 = local_c8;
          sVar23 = local_128._M_string_length;
          _Var22._M_p = local_128._M_dataplus._M_p;
          lVar10 = *(long *)(result + 0x20);
          FlatVector::VerifyFlatVector(result);
          pVVar28 = result + 0x28;
          if (local_b8 == 0 && (float **)local_128.field_2._M_allocated_capacity == (float **)0x0) {
            if (pUVar8 != (UnifiedVectorFormat *)0x0) {
              lVar12 = *(long *)_Var22._M_p;
              lVar14 = *(long *)pUVar41;
              pUVar41 = (UnifiedVectorFormat *)0x0;
              do {
                pUVar31 = pUVar41;
                if (lVar12 != 0) {
                  pUVar31 = (UnifiedVectorFormat *)(ulong)*(uint *)(lVar12 + (long)pUVar41 * 4);
                }
                pUVar40 = pUVar41;
                if (lVar14 != 0) {
                  pUVar40 = (UnifiedVectorFormat *)(ulong)*(uint *)(lVar14 + (long)pUVar41 * 4);
                }
                uVar4 = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(sVar23 + pUVar31 * 0x10))
                        ->_M_use_count;
                uVar16 = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(sVar23 + pUVar31 * 0x10))
                         ->_M_weak_count;
                left.length._4_4_ = uVar16;
                left.length._0_4_ = uVar4;
                uVar5 = p_Var13[(long)pUVar40]._M_use_count;
                uVar17 = p_Var13[(long)pUVar40]._M_weak_count;
                right.length._4_4_ = uVar17;
                right.length._0_4_ = uVar5;
                fun_00.lhs_data = (float **)local_78;
                fun_00.func_name = (string *)pBVar25;
                fun_00.rhs_data = &local_80;
                right.offset = (uint64_t)p_Var13[(long)pUVar40]._vptr__Sp_counted_base;
                left.offset = (uint64_t)
                              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                              (sVar23 + pUVar31 * 0x10))->_vptr__Sp_counted_base;
                fVar43 = BinaryLambdaWrapperWithNulls::
                         Operation<duckdb::ListGenericFold<float,duckdb::CosineDistanceOp>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::list_entry_t_const&,duckdb::list_entry_t_const&,duckdb::ValidityMask&,unsigned_long)_1_,bool,duckdb::list_entry_t,duckdb::list_entry_t,float>
                                   (fun_00,left,right,(ValidityMask *)pVVar28,(idx_t)pUVar41);
                *(float *)(lVar10 + (long)pUVar41 * 4) = fVar43;
                pUVar41 = pUVar41 + 1;
              } while (pUVar8 != pUVar41);
            }
          }
          else if (pUVar8 != (UnifiedVectorFormat *)0x0) {
            lVar12 = *(long *)_Var22._M_p;
            lVar14 = *(long *)pUVar41;
            pUVar41 = (UnifiedVectorFormat *)0x0;
            do {
              pUVar31 = pUVar41;
              if (lVar12 != 0) {
                pUVar31 = (UnifiedVectorFormat *)(ulong)*(uint *)(lVar12 + (long)pUVar41 * 4);
              }
              pUVar40 = pUVar41;
              if (lVar14 != 0) {
                pUVar40 = (UnifiedVectorFormat *)(ulong)*(uint *)(lVar14 + (long)pUVar41 * 4);
              }
              if ((((float **)local_128.field_2._M_allocated_capacity == (float **)0x0) ||
                  (((ulong)*(float **)
                            (local_128.field_2._M_allocated_capacity + ((ulong)pUVar31 >> 6) * 8) >>
                    ((ulong)pUVar31 & 0x3f) & 1) != 0)) &&
                 ((local_b8 == 0 ||
                  ((*(ulong *)(local_b8 + ((ulong)pUVar40 >> 6) * 8) >> ((ulong)pUVar40 & 0x3f) & 1)
                   != 0)))) {
                uVar6 = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(sVar23 + pUVar31 * 0x10))
                        ->_M_use_count;
                uVar18 = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(sVar23 + pUVar31 * 0x10))
                         ->_M_weak_count;
                left_03.length._4_4_ = uVar18;
                left_03.length._0_4_ = uVar6;
                uVar7 = p_Var13[(long)pUVar40]._M_use_count;
                uVar19 = p_Var13[(long)pUVar40]._M_weak_count;
                right_00.length._4_4_ = uVar19;
                right_00.length._0_4_ = uVar7;
                fun_04.lhs_data = (float **)local_78;
                fun_04.func_name = (string *)pBVar25;
                fun_04.rhs_data = &local_80;
                right_00.offset = (uint64_t)p_Var13[(long)pUVar40]._vptr__Sp_counted_base;
                left_03.offset =
                     (uint64_t)
                     ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(sVar23 + pUVar31 * 0x10))->
                     _vptr__Sp_counted_base;
                fVar43 = BinaryLambdaWrapperWithNulls::
                         Operation<duckdb::ListGenericFold<float,duckdb::CosineDistanceOp>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::list_entry_t_const&,duckdb::list_entry_t_const&,duckdb::ValidityMask&,unsigned_long)_1_,bool,duckdb::list_entry_t,duckdb::list_entry_t,float>
                                   (fun_04,left_03,right_00,(ValidityMask *)pVVar28,(idx_t)pUVar41);
                *(float *)(lVar10 + (long)pUVar41 * 4) = fVar43;
              }
              else {
                if (*(long *)pVVar28 == 0) {
                  local_d0 = *(unsigned_long *)(result + 0x40);
                  make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                            ((duckdb *)&local_138,&local_d0);
                  p_Var21 = p_Stack_130;
                  pUVar31 = local_138;
                  local_138 = (UnifiedVectorFormat *)0x0;
                  p_Stack_130 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                  p_Var15 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(result + 0x38);
                  *(UnifiedVectorFormat **)(result + 0x30) = pUVar31;
                  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(result + 0x38) = p_Var21;
                  if (p_Var15 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var15);
                  }
                  if (p_Stack_130 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_130);
                  }
                  pTVar30 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::
                            operator->((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>
                                        *)(result + 0x30));
                  *(unsigned_long **)pVVar28 =
                       (unsigned_long *)
                       (pTVar30->owned_data).
                       super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t
                       .super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>.
                       _M_t.
                       super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                       .super__Head_base<0UL,_unsigned_long_*,_false>;
                }
                bVar20 = (byte)pUVar41 & 0x3f;
                puVar1 = (ulong *)(*(long *)pVVar28 + ((ulong)pUVar41 >> 6) * 8);
                *puVar1 = *puVar1 & (-2L << bVar20 | 0xfffffffffffffffeU >> 0x40 - bVar20);
              }
              pUVar41 = pUVar41 + 1;
            } while (pUVar8 != pUVar41);
          }
          if (local_88 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_88);
          }
          if (local_a8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_a8);
          }
          if (local_e8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_e8);
          }
          if (local_108 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_108);
          }
        }
        goto LAB_0069f596;
      }
      plVar11 = *(list_entry_t **)(vector + 0x20);
      lVar10 = *(long *)(pvVar26 + 0x20);
      if ((*(byte **)(vector + 0x28) == (byte *)0x0) || ((**(byte **)(vector + 0x28) & 1) != 0)) {
        duckdb::Vector::SetVectorType(VVar37);
        lVar12 = *(long *)(result + 0x20);
        FlatVector::VerifyFlatVector(result);
        pVVar28 = result + 0x28;
        FlatVector::VerifyFlatVector(pvVar26);
        *(UnifiedVectorFormat **)(result + 0x40) = pUVar8;
        if (*(long *)(pvVar26 + 0x28) == 0) {
          p_Var13 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(result + 0x38);
          *(undefined8 *)(result + 0x30) = 0;
          *(undefined8 *)(result + 0x38) = 0;
          local_c8 = pUVar8;
          if (p_Var13 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var13);
          }
          _Var32._M_head_impl = (unsigned_long *)0x0;
        }
        else {
          local_c8 = pUVar8;
          make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long*const&,unsigned_long&>
                    ((duckdb *)&local_128,(unsigned_long **)(pvVar26 + 0x28),
                     (unsigned_long *)&local_c8);
          sVar23 = local_128._M_string_length;
          _Var22._M_p = local_128._M_dataplus._M_p;
          local_128._M_dataplus._M_p = (pointer)0x0;
          local_128._M_string_length = 0;
          p_Var13 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(result + 0x38);
          *(pointer *)(result + 0x30) = _Var22._M_p;
          *(size_type *)(result + 0x38) = sVar23;
          if (p_Var13 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var13);
          }
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_128._M_string_length !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_128._M_string_length);
          }
          pTVar30 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                              ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)
                               (result + 0x30));
          _Var32._M_head_impl =
               (pTVar30->owned_data).
               super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
               super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
               super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
               super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
        }
        *(unsigned_long **)pVVar28 = _Var32._M_head_impl;
        if (_Var32._M_head_impl == (unsigned_long *)0x0) {
          if (pUVar8 != (UnifiedVectorFormat *)0x0) {
            lVar44 = *plVar11;
            local_188 = (uint64_t *)(lVar10 + 8);
            pUVar41 = (UnifiedVectorFormat *)0x0;
            do {
              fun_07.lhs_data = (float **)local_78;
              fun_07.func_name = (string *)pBVar25;
              fun_07.rhs_data = &local_80;
              right_03.length = *local_188;
              right_03.offset = local_188[-1];
              fVar43 = BinaryLambdaWrapperWithNulls::
                       Operation<duckdb::ListGenericFold<float,duckdb::CosineDistanceOp>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::list_entry_t_const&,duckdb::list_entry_t_const&,duckdb::ValidityMask&,unsigned_long)_1_,bool,duckdb::list_entry_t,duckdb::list_entry_t,float>
                                 (fun_07,lVar44,right_03,(ValidityMask *)pVVar28,(idx_t)pUVar41);
              *(float *)(lVar12 + (long)pUVar41 * 4) = fVar43;
              pUVar41 = pUVar41 + 1;
              local_188 = local_188 + 2;
            } while (pUVar8 != pUVar41);
          }
        }
        else if ((UnifiedVectorFormat *)0x3f < pUVar8 + 0x3f) {
          lVar10 = lVar10 + 8;
          uVar34 = 0;
          pUVar41 = (UnifiedVectorFormat *)0x0;
          do {
            if (*(long *)pVVar28 == 0) {
              uVar35 = 0xffffffffffffffff;
            }
            else {
              uVar35 = *(ulong *)(*(long *)pVVar28 + uVar34 * 8);
            }
            pUVar31 = pUVar41 + 0x40;
            if (pUVar8 <= pUVar41 + 0x40) {
              pUVar31 = pUVar8;
            }
            pUVar40 = pUVar31;
            if (uVar35 != 0) {
              pUVar40 = pUVar41;
              if (uVar35 == 0xffffffffffffffff) {
                if (pUVar41 < pUVar31) {
                  lVar44 = *plVar11;
                  puVar38 = (uint64_t *)((long)pUVar41 * 0x10 + lVar10);
                  do {
                    fun_05.lhs_data = (float **)local_78;
                    fun_05.func_name = (string *)pBVar25;
                    fun_05.rhs_data = &local_80;
                    right_01.length = *puVar38;
                    right_01.offset = puVar38[-1];
                    fVar43 = BinaryLambdaWrapperWithNulls::
                             Operation<duckdb::ListGenericFold<float,duckdb::CosineDistanceOp>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::list_entry_t_const&,duckdb::list_entry_t_const&,duckdb::ValidityMask&,unsigned_long)_1_,bool,duckdb::list_entry_t,duckdb::list_entry_t,float>
                                       (fun_05,lVar44,right_01,(ValidityMask *)pVVar28,
                                        (idx_t)pUVar40);
                    *(float *)(lVar12 + (long)pUVar40 * 4) = fVar43;
                    pUVar40 = pUVar40 + 1;
                    puVar38 = puVar38 + 2;
                  } while (pUVar31 != pUVar40);
                }
              }
              else if (pUVar41 < pUVar31) {
                puVar38 = (uint64_t *)((long)pUVar41 * 0x10 + lVar10);
                uVar36 = 0;
                do {
                  if ((uVar35 >> (uVar36 & 0x3f) & 1) != 0) {
                    fun_06.lhs_data = (float **)local_78;
                    fun_06.func_name = (string *)pBVar25;
                    fun_06.rhs_data = &local_80;
                    right_02.length = *puVar38;
                    right_02.offset = puVar38[-1];
                    fVar43 = BinaryLambdaWrapperWithNulls::
                             Operation<duckdb::ListGenericFold<float,duckdb::CosineDistanceOp>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::list_entry_t_const&,duckdb::list_entry_t_const&,duckdb::ValidityMask&,unsigned_long)_1_,bool,duckdb::list_entry_t,duckdb::list_entry_t,float>
                                       (fun_06,*plVar11,right_02,(ValidityMask *)pVVar28,
                                        (idx_t)(pUVar41 + uVar36));
                    *(float *)((long)pUVar41 * 4 + lVar12 + uVar36 * 4) = fVar43;
                  }
                  uVar36 = uVar36 + 1;
                  puVar38 = puVar38 + 2;
                } while (pUVar41 + (uVar36 - (long)pUVar31) != (UnifiedVectorFormat *)0x0);
                pUVar40 = pUVar41 + uVar36;
              }
            }
            uVar34 = uVar34 + 1;
            pUVar41 = pUVar40;
          } while (uVar34 != (ulong)(pUVar8 + 0x3f) >> 6);
        }
        goto LAB_0069f596;
      }
    }
    duckdb::Vector::SetVectorType(VVar37);
  }
  duckdb::ConstantVector::SetNull(result,true);
LAB_0069f596:
  cVar24 = duckdb::DataChunk::AllConstant();
  if (cVar24 != '\0') {
    duckdb::Vector::SetVectorType(VVar37);
  }
  return;
}

Assistant:

static void ListGenericFold(DataChunk &args, ExpressionState &state, Vector &result) {
	const auto &lstate = state.Cast<ExecuteFunctionState>();
	const auto &expr = lstate.expr.Cast<BoundFunctionExpression>();
	const auto &func_name = expr.function.name;

	auto count = args.size();

	auto &lhs_vec = args.data[0];
	auto &rhs_vec = args.data[1];

	const auto lhs_count = ListVector::GetListSize(lhs_vec);
	const auto rhs_count = ListVector::GetListSize(rhs_vec);

	auto &lhs_child = ListVector::GetEntry(lhs_vec);
	auto &rhs_child = ListVector::GetEntry(rhs_vec);

	lhs_child.Flatten(lhs_count);
	rhs_child.Flatten(rhs_count);

	D_ASSERT(lhs_child.GetVectorType() == VectorType::FLAT_VECTOR);
	D_ASSERT(rhs_child.GetVectorType() == VectorType::FLAT_VECTOR);

	if (!FlatVector::Validity(lhs_child).CheckAllValid(lhs_count)) {
		throw InvalidInputException("%s: left argument can not contain NULL values", func_name);
	}

	if (!FlatVector::Validity(rhs_child).CheckAllValid(rhs_count)) {
		throw InvalidInputException("%s: right argument can not contain NULL values", func_name);
	}

	auto lhs_data = FlatVector::GetData<TYPE>(lhs_child);
	auto rhs_data = FlatVector::GetData<TYPE>(rhs_child);

	BinaryExecutor::ExecuteWithNulls<list_entry_t, list_entry_t, TYPE>(
	    lhs_vec, rhs_vec, result, count,
	    [&](const list_entry_t &left, const list_entry_t &right, ValidityMask &mask, idx_t row_idx) {
		    if (left.length != right.length) {
			    throw InvalidInputException(
			        "%s: list dimensions must be equal, got left length '%d' and right length '%d'", func_name,
			        left.length, right.length);
		    }

		    if (!OP::ALLOW_EMPTY && left.length == 0) {
			    mask.SetInvalid(row_idx);
			    return TYPE();
		    }

		    return OP::Operation(lhs_data + left.offset, rhs_data + right.offset, left.length);
	    });

	if (args.AllConstant()) {
		result.SetVectorType(VectorType::CONSTANT_VECTOR);
	}
}